

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_reader
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  t_field *ptVar1;
  t_struct *ptVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  e_req eVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_type *ptVar9;
  reference pptVar10;
  string *psVar11;
  string local_440;
  string local_420;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_400
  ;
  t_field **local_3f8;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  char *local_230;
  char *isset_prefix;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_208
  ;
  t_field **local_200;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_178
  ;
  t_field **local_170;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string local_48;
  byte local_21;
  t_struct *ptStack_20;
  bool pointers_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  local_21 = pointers;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  if ((this->gen_templates_ & 1U) == 0) {
    poVar8 = t_generator::indent((t_generator *)this,out);
    poVar8 = std::operator<<(poVar8,"uint32_t ");
    iVar4 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_00,iVar4));
    poVar8 = std::operator<<(poVar8,"::read(::apache::thrift::protocol::TProtocol* iprot) {");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
    poVar8 = std::operator<<(out,(string *)&local_48);
    poVar8 = std::operator<<(poVar8,"template <class Protocol_>");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&fields,(t_generator *)this);
    poVar8 = std::operator<<(poVar8,(string *)&fields);
    poVar8 = std::operator<<(poVar8,"uint32_t ");
    iVar4 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var,iVar4));
    poVar8 = std::operator<<(poVar8,"::read(Protocol_* iprot) {");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&fields);
    std::__cxx11::string::~string((string *)&local_48);
  }
  t_generator::indent_up((t_generator *)this);
  f_iter._M_current = (t_field **)t_struct::get_members(ptStack_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_88);
  poVar8 = std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_a8);
  poVar8 = std::operator<<(poVar8,
                           "::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_c8,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_c8);
  poVar8 = std::operator<<(poVar8,"uint32_t xfer = 0;");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_e8,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_e8);
  poVar8 = std::operator<<(poVar8,"std::string fname;");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_108);
  poVar8 = std::operator<<(poVar8,"::apache::thrift::protocol::TType ftype;");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_128);
  poVar8 = std::operator<<(poVar8,"int16_t fid;");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_148);
  poVar8 = std::operator<<(poVar8,"xfer += iprot->readStructBegin(fname);");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_168);
  poVar8 = std::operator<<(poVar8,"using ::apache::thrift::protocol::TProtocolException;");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_170 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_88._M_current = local_170;
  while( true ) {
    local_178._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar3 = __gnu_cxx::operator!=(&local_88,&local_178);
    if (!bVar3) break;
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_88);
    eVar7 = t_field::get_req(*pptVar10);
    if (eVar7 == T_REQUIRED) {
      poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar8 = std::operator<<(poVar8,"bool isset_");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_88);
      psVar11 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar8 = std::operator<<(poVar8,(string *)psVar11);
      poVar8 = std::operator<<(poVar8," = false;");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_88);
  }
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar8 = std::operator<<(poVar8,"while (true)");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tstruct_local);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar8 = std::operator<<(poVar8,"xfer += iprot->readFieldBegin(fname, ftype, fid);");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  ptVar2 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar8 = std::operator<<((ostream *)ptVar2,(string *)&local_198);
  poVar8 = std::operator<<(poVar8,"if (ftype == ::apache::thrift::protocol::T_STOP) {");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_1b8);
  poVar8 = std::operator<<(poVar8,"  break;");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1d8,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_1d8);
  poVar8 = std::operator<<(poVar8,"}");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  bVar3 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
  ptVar2 = tstruct_local;
  if (bVar3) {
    t_generator::indent_abi_cxx11_(&local_1f8,(t_generator *)this);
    poVar8 = std::operator<<((ostream *)ptVar2,(string *)&local_1f8);
    poVar8 = std::operator<<(poVar8,"xfer += iprot->skip(ftype);");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  else {
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar8 = std::operator<<(poVar8,"switch (fid)");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)tstruct_local);
    local_200 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    local_88._M_current = local_200;
    while( true ) {
      local_208._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar3 = __gnu_cxx::operator!=(&local_88,&local_208);
      ptVar2 = tstruct_local;
      if (!bVar3) break;
      poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar8 = std::operator<<(poVar8,"case ");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_88);
      iVar5 = t_field::get_key(*pptVar10);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
      poVar8 = std::operator<<(poVar8,":");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_up((t_generator *)this);
      poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
      poVar8 = std::operator<<(poVar8,"if (ftype == ");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_88);
      ptVar9 = t_field::get_type(*pptVar10);
      type_to_enum_abi_cxx11_((string *)&isset_prefix,this,ptVar9);
      poVar8 = std::operator<<(poVar8,(string *)&isset_prefix);
      poVar8 = std::operator<<(poVar8,") {");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&isset_prefix);
      t_generator::indent_up((t_generator *)this);
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_88);
      eVar7 = t_field::get_req(*pptVar10);
      local_230 = "isset_";
      if (eVar7 != T_REQUIRED) {
        local_230 = "this->__isset.";
      }
      if ((local_21 & 1) == 0) {
LAB_00205291:
        ptVar2 = tstruct_local;
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_88);
        ptVar1 = *pptVar10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2a0,"this->",&local_2a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c8,"",&local_2c9);
        generate_deserialize_field(this,(ostream *)ptVar2,ptVar1,&local_2a0,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      }
      else {
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_88);
        ptVar9 = t_field::get_type(*pptVar10);
        uVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])();
        ptVar2 = tstruct_local;
        if ((uVar6 & 1) != 0) goto LAB_00205291;
        pptVar10 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_88);
        ptVar1 = *pptVar10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_250,"(*(this->",&local_251);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_278,"))",&local_279);
        generate_deserialize_field(this,(ostream *)ptVar2,ptVar1,&local_250,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator((allocator<char> *)&local_279);
        std::__cxx11::string::~string((string *)&local_250);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
      }
      ptVar2 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_2f0,(t_generator *)this);
      poVar8 = std::operator<<((ostream *)ptVar2,(string *)&local_2f0);
      poVar8 = std::operator<<(poVar8,local_230);
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_88);
      psVar11 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar8 = std::operator<<(poVar8,(string *)psVar11);
      poVar8 = std::operator<<(poVar8," = true;");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_2f0);
      t_generator::indent_down((t_generator *)this);
      ptVar2 = tstruct_local;
      t_generator::indent_abi_cxx11_(&local_310,(t_generator *)this);
      poVar8 = std::operator<<((ostream *)ptVar2,(string *)&local_310);
      poVar8 = std::operator<<(poVar8,"} else {");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_330,(t_generator *)this);
      poVar8 = std::operator<<(poVar8,(string *)&local_330);
      poVar8 = std::operator<<(poVar8,"  xfer += iprot->skip(ftype);");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_350,(t_generator *)this);
      poVar8 = std::operator<<(poVar8,(string *)&local_350);
      poVar8 = std::operator<<(poVar8,"}");
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_370,(t_generator *)this);
      poVar8 = std::operator<<(poVar8,(string *)&local_370);
      poVar8 = std::operator<<(poVar8,"break;");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_310);
      t_generator::indent_down((t_generator *)this);
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_88);
    }
    t_generator::indent_abi_cxx11_(&local_390,(t_generator *)this);
    poVar8 = std::operator<<((ostream *)ptVar2,(string *)&local_390);
    poVar8 = std::operator<<(poVar8,"default:");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3b0,(t_generator *)this);
    poVar8 = std::operator<<(poVar8,(string *)&local_3b0);
    poVar8 = std::operator<<(poVar8,"  xfer += iprot->skip(ftype);");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_3d0,(t_generator *)this);
    poVar8 = std::operator<<(poVar8,(string *)&local_3d0);
    poVar8 = std::operator<<(poVar8,"  break;");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  }
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar8 = std::operator<<(poVar8,"xfer += iprot->readFieldEnd();");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)tstruct_local);
  poVar8 = std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3f0,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_3f0);
  poVar8 = std::operator<<(poVar8,"xfer += iprot->readStructEnd();");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  local_3f8 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_88._M_current = local_3f8;
  while( true ) {
    local_400._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar3 = __gnu_cxx::operator!=(&local_88,&local_400);
    if (!bVar3) break;
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
               ::operator*(&local_88);
    eVar7 = t_field::get_req(*pptVar10);
    ptVar2 = tstruct_local;
    if (eVar7 == T_REQUIRED) {
      t_generator::indent_abi_cxx11_(&local_420,(t_generator *)this);
      poVar8 = std::operator<<((ostream *)ptVar2,(string *)&local_420);
      poVar8 = std::operator<<(poVar8,"if (!isset_");
      pptVar10 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_88);
      psVar11 = t_field::get_name_abi_cxx11_(*pptVar10);
      poVar8 = std::operator<<(poVar8,(string *)psVar11);
      poVar8 = std::operator<<(poVar8,')');
      poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_440,(t_generator *)this);
      poVar8 = std::operator<<(poVar8,(string *)&local_440);
      poVar8 = std::operator<<(poVar8,
                               "  throw TProtocolException(TProtocolException::INVALID_DATA);");
      std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::~string((string *)&local_420);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_88);
  }
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar8 = std::operator<<(poVar8,"return xfer;");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar8 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar8 = std::operator<<(poVar8,"}");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_reader(ostream& out, t_struct* tstruct, bool pointers) {
  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::read(Protocol_* iprot) {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::read(::apache::thrift::protocol::TProtocol* iprot) {" << endl;
  }
  indent_up();

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Declare stack tmp variables
  out << endl
      << indent() << "::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);" << endl
      << indent() << "uint32_t xfer = 0;" << endl
      << indent() << "std::string fname;" << endl
      << indent() << "::apache::thrift::protocol::TType ftype;" << endl
      << indent() << "int16_t fid;" << endl
      << endl
      << indent() << "xfer += iprot->readStructBegin(fname);" << endl
      << endl
      << indent() << "using ::apache::thrift::protocol::TProtocolException;" << endl
      << endl;

  // Required variables aren't in __isset, so we need tmp vars to check them.
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED)
      indent(out) << "bool isset_" << (*f_iter)->get_name() << " = false;" << endl;
  }
  out << endl;

  // Loop over reading in fields
  indent(out) << "while (true)" << endl;
  scope_up(out);

  // Read beginning field marker
  indent(out) << "xfer += iprot->readFieldBegin(fname, ftype, fid);" << endl;

  // Check for field STOP marker
  out << indent() << "if (ftype == ::apache::thrift::protocol::T_STOP) {" << endl << indent()
      << "  break;" << endl << indent() << "}" << endl;

  if (fields.empty()) {
    out << indent() << "xfer += iprot->skip(ftype);" << endl;
  } else {
    // Switch statement on the field we are reading
    indent(out) << "switch (fid)" << endl;

    scope_up(out);

    // Generate deserialization code for known cases
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
      indent_up();
      indent(out) << "if (ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
      indent_up();

      const char* isset_prefix = ((*f_iter)->get_req() != t_field::T_REQUIRED) ? "this->__isset."
                                                                               : "isset_";

#if 0
          // This code throws an exception if the same field is encountered twice.
          // We've decided to leave it out for performance reasons.
          // TODO(dreiss): Generate this code and "if" it out to make it easier
          // for people recompiling thrift to include it.
          out <<
            indent() << "if (" << isset_prefix << (*f_iter)->get_name() << ")" << endl <<
            indent() << "  throw TProtocolException(TProtocolException::INVALID_DATA);" << endl;
#endif

      if (pointers && !(*f_iter)->get_type()->is_xception()) {
        generate_deserialize_field(out, *f_iter, "(*(this->", "))");
      } else {
        generate_deserialize_field(out, *f_iter, "this->");
      }
      out << indent() << isset_prefix << (*f_iter)->get_name() << " = true;" << endl;
      indent_down();
      out << indent() << "} else {" << endl << indent() << "  xfer += iprot->skip(ftype);" << endl
          <<
          // TODO(dreiss): Make this an option when thrift structs
          // have a common base class.
          // indent() << "  throw TProtocolException(TProtocolException::INVALID_DATA);" << endl <<
          indent() << "}" << endl << indent() << "break;" << endl;
      indent_down();
    }

    // In the default case we skip the field
    out << indent() << "default:" << endl << indent() << "  xfer += iprot->skip(ftype);" << endl
        << indent() << "  break;" << endl;

    scope_down(out);
  } //!fields.empty()
  // Read field end marker
  indent(out) << "xfer += iprot->readFieldEnd();" << endl;

  scope_down(out);

  out << endl << indent() << "xfer += iprot->readStructEnd();" << endl;

  // Throw if any required fields are missing.
  // We do this after reading the struct end so that
  // there might possibly be a chance of continuing.
  out << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED)
      out << indent() << "if (!isset_" << (*f_iter)->get_name() << ')' << endl << indent()
          << "  throw TProtocolException(TProtocolException::INVALID_DATA);" << endl;
  }

  indent(out) << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}